

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O2

void pnga_step_max_patch(Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,Integer *bhi
                        ,void *result)

{
  long *plVar1;
  char *pcVar2;
  long *plVar3;
  int iVar4;
  long lVar5;
  logical lVar6;
  Integer IVar7;
  double *val;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  uint uVar18;
  char *A_ptr;
  char *local_648;
  Integer *local_640;
  Integer local_638;
  Integer g_c;
  Integer atype;
  Integer andim_1;
  Integer andim;
  int local_610;
  int local_60c;
  float fresult;
  int iresult;
  long local_600;
  Integer bndim;
  Integer atype_1;
  Integer loA [7];
  long lresult;
  double dresult;
  Integer hiA [7];
  Integer compatible;
  Integer btype;
  Integer ldA [7];
  long lStack_500;
  Integer local_4f8;
  long local_4f0 [7];
  Integer bunit [7];
  Integer aIStack_478 [8];
  long local_438 [8];
  Integer bdims [7];
  Integer adims [7];
  Integer adims_1 [7];
  Integer index [7];
  
  bVar17 = _ga_sync_begin != 0;
  local_60c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  local_640 = alo;
  local_638 = g_b;
  if (bVar17) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_step_max_patch_");
  IVar7 = local_638;
  pnga_check_handle(local_638,"ga_step_max_patch_");
  pnga_inquire(g_a,&atype,&andim,adims);
  pnga_inquire(IVar7,&btype,&bndim,bdims);
  if (atype != btype) {
    pnga_error(" ga_step_max_patch_: types mismatch ",0);
  }
  for (lVar16 = 0; lVar16 < andim; lVar16 = lVar16 + 1) {
    if ((local_640[lVar16] < 1) || (adims[lVar16] < ahi[lVar16])) {
      pnga_error("g_a indices out of range ",g_a);
    }
  }
  for (lVar16 = 0; lVar16 < bndim; lVar16 = lVar16 + 1) {
    if ((blo[lVar16] < 1) || (bdims[lVar16] < bhi[lVar16])) {
      pnga_error("g_b indices out of range ",local_638);
    }
  }
  lVar10 = 0;
  lVar16 = 0;
  if (0 < andim) {
    lVar16 = andim;
  }
  lVar5 = 1;
  for (; lVar16 != lVar10; lVar10 = lVar10 + 1) {
    lVar5 = lVar5 * ((ahi[lVar10] - local_640[lVar10]) + 1);
  }
  lVar10 = 0;
  lVar16 = 0;
  if (0 < bndim) {
    lVar16 = bndim;
  }
  lVar14 = 1;
  for (; lVar16 != lVar10; lVar10 = lVar10 + 1) {
    lVar14 = lVar14 * ((bhi[lVar10] - blo[lVar10]) + 1);
  }
  if (lVar14 != lVar5) {
    pnga_error(" ga_step_max_patch_ capacities of patches do not match ",0);
  }
  lVar6 = pnga_comp_patch(andim,local_640,ahi,bndim,blo,bhi);
  compatible = (Integer)(lVar6 != 0);
  IVar7 = pnga_type_f2c(0x3f2);
  pnga_gop(IVar7,&compatible,1,"&&");
  if (compatible == 0) {
    pnga_error(" ga_step_max_patch_ mismatched patchs ",0);
  }
  switch(atype) {
  case 0x3e9:
    val = (double *)&iresult;
    break;
  case 0x3ea:
    val = (double *)&lresult;
    break;
  case 0x3eb:
    val = (double *)&fresult;
    break;
  case 0x3ec:
    val = &dresult;
    break;
  default:
    pcVar12 = "Ga_step_max_patch_: wrong data type.";
    goto LAB_0011b35f;
  case 0x3ee:
  case 0x3ef:
    pcVar12 = "Ga_step_max_patch_: unavalable for complex datatype.";
LAB_0011b35f:
    pnga_error(pcVar12,atype);
    val = (double *)0x0;
  }
  if (g_a != local_638) {
    local_600 = 0x7fffffffffffffff;
    IVar7 = has_negative_elem(g_a,local_640,ahi);
    if (IVar7 == 1) {
      pnga_error("ga_step_max_patch_: g_a has negative element.",-1);
    }
    pnga_duplicate(g_a,&g_c,"Temp");
    if (g_c == 0) {
      pnga_error("ga_step_max_patch_:fail to duplicate array c",g_a);
    }
    pnga_elem_step_divide_patch(g_a,local_640,ahi,local_638,blo,bhi,g_c,local_640,ahi);
    IVar7 = g_c;
    pnga_nodeid();
    local_610 = _ga_sync_end;
    bVar17 = _ga_sync_begin != 0;
    _ga_sync_begin = 1;
    _ga_sync_end = _ga_sync_begin;
    if (bVar17) {
      pnga_sync();
    }
    pnga_check_handle(IVar7,"gai_elem3_patch_");
    pnga_inquire(IVar7,&atype_1,&andim_1,adims_1);
    pnga_total_blocks(IVar7);
    for (lVar16 = 0; lVar16 < andim_1; lVar16 = lVar16 + 1) {
      if ((local_640[lVar16] < 1) || (adims_1[lVar16] < ahi[lVar16])) {
        pnga_error("g_a indices out of range ",IVar7);
      }
    }
    pnga_local_iterator_init(IVar7,(_iterator_hdl *)index);
    local_600 = local_600 + 2;
    do {
      iVar4 = pnga_local_iterator_next((_iterator_hdl *)index,loA,hiA,&A_ptr,ldA);
      if (iVar4 == 0) goto LAB_0011b9e2;
      lVar16 = 0;
      if (0 < andim_1) {
        lVar16 = andim_1;
      }
      for (lVar10 = 0; lVar16 != lVar10; lVar10 = lVar10 + 1) {
        aIStack_478[lVar10] = loA[lVar10];
      }
      lVar6 = pnga_patch_intersect(local_640,ahi,loA,hiA,andim_1);
      if (lVar6 != 0) {
        lVar16 = 0;
        if (0 < andim_1) {
          lVar16 = andim_1;
        }
        lVar10 = 0;
        do {
          if (lVar16 == lVar10) goto LAB_0011b6b0;
          plVar3 = aIStack_478 + lVar10;
          plVar1 = loA + lVar10;
          lVar10 = lVar10 + 1;
        } while (*plVar1 <= *plVar3);
        lVar16 = andim_1 + -1;
        if (lVar16 < 1) {
          lVar16 = 0;
        }
        lVar5 = 0;
        lVar10 = 1;
        for (lVar14 = 0; lVar16 != lVar14; lVar14 = lVar14 + 1) {
          lVar5 = lVar5 + (loA[lVar14] - aIStack_478[lVar14]) * lVar10;
          lVar10 = lVar10 * ldA[lVar14];
        }
        if (6 < atype_1 - 0x3e9U) {
switchD_0011b61a_caseD_3ed:
          pnga_error(" wrong data type ",atype_1);
          goto LAB_0011b6b0;
        }
        lVar5 = (loA[andim_1 + -1] - aIStack_478[andim_1 + -1]) * lVar10 + lVar5;
        switch(atype_1) {
        case 0x3e9:
          local_648 = A_ptr + lVar5 * 4;
          uVar15 = 0x3e9;
          break;
        case 0x3ea:
          local_648 = A_ptr + lVar5 * 8;
          uVar15 = 0x3ea;
          break;
        case 0x3eb:
          local_648 = A_ptr + lVar5 * 4;
          uVar15 = 0x3eb;
          break;
        case 0x3ec:
          local_648 = A_ptr + lVar5 * 8;
          uVar15 = 0x3ec;
          break;
        case 0x3ed:
          goto switchD_0011b61a_caseD_3ed;
        case 0x3ee:
          lVar5 = lVar5 * 8;
          goto LAB_0011b6ab;
        case 0x3ef:
          lVar5 = lVar5 * 0x10;
LAB_0011b6ab:
          A_ptr = A_ptr + lVar5;
LAB_0011b6b0:
          local_648 = A_ptr;
          uVar15 = atype_1;
        }
        IVar7 = andim_1;
        lVar16 = 1;
        lVar10 = lVar16;
        for (; lVar16 < andim_1; lVar16 = lVar16 + 1) {
          lVar10 = lVar10 * ((hiA[lVar16] - loA[lVar16]) + 1);
        }
        local_438[0] = 0;
        local_438[1] = 0;
        bunit[0] = 1;
        bunit[1] = 1;
        local_4f8 = ldA[0];
        local_4f0[0] = ldA[0] * ldA[1];
        for (lVar16 = 2; lVar16 < andim_1; lVar16 = lVar16 + 1) {
          local_438[lVar16] = 0;
          bunit[lVar16] = ((hiA[lVar16 + -1] - loA[lVar16 + -1]) + 1) * bunit[lVar16 + -1];
          (&local_4f8)[lVar16] = ldA[lVar16] * (&lStack_500)[lVar16];
        }
        local_638 = (Integer)(int)uVar15;
        if (lVar10 < 1) {
          lVar10 = 0;
        }
        lVar16 = 0;
        pcVar12 = (char *)0x0;
        A_ptr = local_648;
LAB_0011b799:
        if (lVar16 != lVar10) {
          lVar16 = lVar16 + 1;
          lVar14 = 0;
          for (lVar5 = 1; lVar5 < IVar7; lVar5 = lVar5 + 1) {
            lVar14 = lVar14 + (&lStack_500)[lVar5] * local_438[lVar5];
            lVar13 = local_438[lVar5] + (ulong)(lVar16 % bunit[lVar5] == 0);
            lVar8 = 0;
            if (lVar13 <= hiA[lVar5] - loA[lVar5]) {
              lVar8 = lVar13;
            }
            local_438[lVar5] = lVar8;
          }
          switch(uVar15) {
          case 0x3e9:
            pcVar12 = local_648 + lVar14 * 4;
            iVar4 = (int)hiA[0] - (int)loA[0];
LAB_0011b92c:
            uVar18 = iVar4 + 1U;
            if ((int)(iVar4 + 1U) < 1) {
              uVar18 = 0;
            }
            for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
              if (0 < *(int *)(pcVar12 + uVar9 * 4)) {
                pcVar2 = pcVar12 + uVar9 * 4;
                pcVar2[0] = '\x01';
                pcVar2[1] = '\0';
                pcVar2[2] = '\0';
                pcVar2[3] = -0x80;
              }
            }
            goto LAB_0011b799;
          case 0x3ea:
            pcVar12 = local_648 + lVar14 * 8;
            iVar4 = (int)hiA[0] - (int)loA[0];
LAB_0011b95c:
            uVar18 = iVar4 + 1U;
            if ((int)(iVar4 + 1U) < 1) {
              uVar18 = 0;
            }
            for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
              if (0 < *(long *)(pcVar12 + uVar9 * 8)) {
                *(long *)(pcVar12 + uVar9 * 8) = local_600;
              }
            }
            goto LAB_0011b799;
          case 0x3eb:
            pcVar12 = local_648 + lVar14 * 4;
            iVar11 = (int)hiA[0] - (int)loA[0];
            break;
          case 0x3ec:
            pcVar12 = local_648 + lVar14 * 8;
            iVar4 = (int)hiA[0] - (int)loA[0];
LAB_0011b98f:
            uVar18 = iVar4 + 1U;
            if ((int)(iVar4 + 1U) < 1) {
              uVar18 = 0;
            }
            for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
              if (0.0 < *(double *)(pcVar12 + uVar9 * 8)) {
                pcVar2 = pcVar12 + uVar9 * 8;
                pcVar2[0] = '3';
                pcVar2[1] = 't';
                pcVar2[2] = -0x54;
                pcVar2[3] = '<';
                pcVar2[4] = '\x1f';
                pcVar2[5] = '{';
                pcVar2[6] = -0x54;
                pcVar2[7] = -1;
              }
            }
            goto LAB_0011b799;
          default:
            pnga_error(" ngai_elem3_patch_: wrong data type ",uVar15);
            iVar11 = (int)hiA[0];
            iVar4 = (int)loA[0];
            switch((int)uVar15) {
            case 0x3e9:
              iVar4 = (int)hiA[0] - (int)loA[0];
              goto LAB_0011b92c;
            case 0x3ea:
              iVar4 = (int)hiA[0] - (int)loA[0];
              goto LAB_0011b95c;
            case 0x3eb:
              break;
            case 0x3ec:
              iVar4 = (int)hiA[0] - (int)loA[0];
              goto LAB_0011b98f;
            default:
              goto switchD_0011b846_caseD_3ed;
            case 0x3ee:
            case 0x3ef:
              pnga_error("do_stepmax:wrong data type",uVar15 & 0xffffffff);
            }
            iVar11 = iVar11 - iVar4;
          }
          uVar18 = iVar11 + 1U;
          if ((int)(iVar11 + 1U) < 1) {
            uVar18 = 0;
          }
          for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
            if (0.0 < *(float *)(pcVar12 + uVar9 * 4)) {
              pcVar2 = pcVar12 + uVar9 * 4;
              pcVar2[0] = -0x3e;
              pcVar2[1] = -0x43;
              pcVar2[2] = -0x10;
              pcVar2[3] = -4;
            }
          }
          goto LAB_0011b799;
        }
      }
    } while( true );
  }
  switch(atype) {
  case 0x3e9:
    *(undefined4 *)result = 0x7fffffff;
    break;
  case 0x3ea:
    *(undefined8 *)result = 0x7fffffffffffffff;
    break;
  case 0x3eb:
    *(undefined4 *)result = 0x7cf0bdc2;
    break;
  case 0x3ec:
    *(undefined8 *)result = 0x7fac7b1f3cac7433;
    break;
  default:
    pcVar12 = "Ga_step_max_patch_: wrong data type.";
    goto LAB_0011baeb;
  case 0x3ee:
  case 0x3ef:
    pcVar12 = "Ga_step_max_patch_: unavailable for complex datatype.";
LAB_0011baeb:
    pnga_error(pcVar12,atype);
  }
LAB_0011bb57:
  if (local_60c != 0) {
    pnga_sync();
  }
  return;
LAB_0011b9e2:
  if (local_610 != 0) {
    pnga_sync();
  }
  pnga_select_elem(g_c,"max",val,index);
  switch(atype) {
  case 0x3e9:
    iVar4 = -iresult;
    if (0 < iresult) {
      iVar4 = iresult;
    }
    *(int *)result = iVar4;
    break;
  case 0x3ea:
    lVar16 = -lresult;
    if (0 < lresult) {
      lVar16 = lresult;
    }
    *(long *)result = lVar16;
    break;
  case 0x3eb:
    uVar18 = -(uint)(-fresult <= fresult);
    *(uint *)result = ~uVar18 & (uint)-fresult | (uint)fresult & uVar18;
    break;
  case 0x3ec:
    uVar15 = -(ulong)(-dresult <= dresult);
    *(ulong *)result = ~uVar15 & (ulong)-dresult | (ulong)dresult & uVar15;
    break;
  default:
    pcVar12 = "Ga_step_max_patch_: wrong data type.";
    goto LAB_0011baf9;
  case 0x3ee:
  case 0x3ef:
    pcVar12 = "Ga_step_max_patch_: unavailable for complex datatype.";
LAB_0011baf9:
    pnga_error(pcVar12,atype);
  }
  pnga_destroy(g_c);
  goto LAB_0011bb57;
switchD_0011b846_caseD_3ed:
  pnga_error("do_stepmax:wrong data type",local_638);
  goto LAB_0011b799;
}

Assistant:

void pnga_step_max_patch(g_a,  alo, ahi, g_b,  blo, bhi, result) 
     Integer g_a, *alo, *ahi;    /* patch of g_a */
     Integer g_b, *blo, *bhi;    /* patch of g_b */
     void *result;
#if 0
     Integer op; /* operations */
#endif

{
  double  dresult;
  long    lresult;
  Integer atype;
  Integer andim, adims[MAXDIM];
  Integer btype;
  Integer bndim, bdims[MAXDIM];
  Integer index[MAXDIM];
  /* Integer num_blocks_a, num_blocks_b; */
  /* double result = -1; */
  Integer g_c;
  int iresult;
  Integer atotal,btotal;
  float   fresult;
  int local_sync_begin,local_sync_end;
  int i;
  Integer compatible;
  void *sresult = NULL;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  /* Check for valid ga handles. */

  pnga_check_handle(g_a, "ga_step_max_patch_");
  pnga_check_handle(g_b, "ga_step_max_patch_");


  /* get chacteristics of the input ga patches */

  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);
  /* num_blocks_a = pnga_total_blocks(g_a); */
  /* num_blocks_b = pnga_total_blocks(g_b); */

  /* Check for matching types. */
  if(atype != btype) pnga_error(" ga_step_max_patch_: types mismatch ", 0L); 

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", g_b);

  /* check if numbers of elements in patches match each other */
  atotal = 1; for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  btotal = 1; for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);

  if(btotal != atotal)
    pnga_error(" ga_step_max_patch_ capacities of patches do not match ", 0L);

  /* test if patches match */
  if(pnga_comp_patch(andim, alo, ahi, bndim, blo, bhi)) compatible = 1;
  else compatible = 0;
  /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
  pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
  if(!compatible) {
    pnga_error(" ga_step_max_patch_ mismatched patchs ",0);
  }

  switch (atype)
  {
    case C_INT:
      sresult = &iresult;
      break;
    case C_DCPL:
    case C_SCPL:
      pnga_error("Ga_step_max_patch_: unavalable for complex datatype.", 
          atype);
      break;
    case C_DBL:
      sresult = &dresult;
      break;
    case C_FLOAT:
      sresult = &fresult;
      break;
    case C_LONG:
      sresult = &lresult;
      break;
    default:
      pnga_error("Ga_step_max_patch_: wrong data type.", atype);
  }

  if(g_a == g_b) {
    /* It used to say 1, but if ga and gb are the same, and 
       ga is nonnegative then any number of multiples of gb
       can be added to ga still leaving it nonnegative.
     *result = (double)1.0;
     */
    switch (atype)
    {
      case C_INT:
        *(int*)result = GA_INFINITY_I;
        break;
      case C_DCPL:
      case C_SCPL:
        pnga_error("Ga_step_max_patch_: unavailable for complex datatype.", 
            atype);
        break;
      case C_DBL:
        *(double*)result = GA_INFINITY_D;
        break;
      case C_FLOAT:
        *(float*)result = GA_INFINITY_F;
        break;
      case C_LONG:
        *(long*)result = GA_INFINITY_L;
        break;
      default:
        pnga_error("Ga_step_max_patch_: wrong data type.", atype);
    }
  } else {
    /*Now look at each element of the array g_a. 
      If an element of g_a is negative, then simply return */ 
    if(has_negative_elem(g_a, alo, ahi) == 1)
      pnga_error("ga_step_max_patch_: g_a has negative element.", -1);

    /*duplicate an array c to hold the temparate result = g_a/g_b; */
    pnga_duplicate(g_a, &g_c, "Temp");
    if(g_c==0)
      pnga_error("ga_step_max_patch_:fail to duplicate array c", g_a);

    /*
       pnga_elem_divide_patch(g_a, alo, ahi, g_b, blo, bhi, g_c, alo, ahi);
     */
    pnga_elem_step_divide_patch(g_a, alo, ahi, g_b, blo, bhi, 
        g_c, alo, ahi);

    /*Now look at each element of the array g_c. If an element of g_c is positive,
      then replace it with -GA_INFINITY */ 
    ngai_elem3_patch_(g_c, alo, ahi, OP_STEPMAX);  
    /*Then, we will select the maximum of the array g_c*/ 
    pnga_select_elem(g_c, "max", sresult, index); 
    switch (atype)
    {
      case C_INT:
        *(int*)result = GA_ABS(iresult);
        break;
      case C_DCPL:
      case C_SCPL:
        pnga_error("Ga_step_max_patch_: unavailable for complex datatype.", 
            atype);
        break;
      case C_DBL:
        *(double*)result = GA_ABS(dresult);
        break;
      case C_FLOAT:
        *(float*)result = GA_ABS(fresult);
        break;
      case C_LONG:
        *(long*)result = GA_ABS(lresult);
        break;
      default:
        pnga_error("Ga_step_max_patch_: wrong data type.", atype);
    }
    pnga_destroy(g_c);
  }
  if(local_sync_end)pnga_sync();
}